

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnSelect
          (SharedValidator *this,Location *loc,Index result_count,Type *result_types)

{
  Result RVar1;
  Result RVar2;
  bool bVar3;
  TypeVector local_48;
  
  RVar1 = CheckInstr(this,(Opcode)0x17,loc);
  if (result_count < 2) {
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
              ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_48,result_types,
               result_types + result_count);
    RVar2 = TypeChecker::OnSelect(&this->typechecker_,&local_48);
    if (local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    bVar3 = RVar1.enum_ == Error || RVar2.enum_ == Error;
  }
  else {
    RVar2 = PrintError(this,loc,"invalid arity in select instruction: %u.",(ulong)result_count);
    bVar3 = RVar2.enum_ == Error || RVar1.enum_ == Error;
  }
  RVar1.enum_._1_3_ = 0;
  RVar1.enum_._0_1_ = bVar3;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnSelect(const Location& loc,
                                 Index result_count,
                                 Type* result_types) {
  Result result = CheckInstr(Opcode::Select, loc);
  if (result_count > 1) {
    result |=
        PrintError(loc, "invalid arity in select instruction: %" PRIindex ".",
                   result_count);
  } else {
    result |= typechecker_.OnSelect(ToTypeVector(result_count, result_types));
  }
  return result;
}